

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O1

void __thiscall QPaintEngine::QPaintEngine(QPaintEngine *this,PaintEngineFeatures caps)

{
  QPaintEnginePrivate *this_00;
  
  this->_vptr_QPaintEngine = (_func_int **)&PTR__QPaintEngine_007ead70;
  this->state = (QPaintEngineState *)0x0;
  (this->gccaps).super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
  super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i =
       (Int)caps.super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
            super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i;
  this->field_0x14 = this->field_0x14 & 0xf8;
  this_00 = (QPaintEnginePrivate *)operator_new(0xa0);
  QPaintEnginePrivate::QPaintEnginePrivate(this_00);
  (this->d_ptr).d = this_00;
  this_00->q_ptr = this;
  return;
}

Assistant:

QPaintEngine::QPaintEngine(PaintEngineFeatures caps)
    : state(nullptr),
      gccaps(caps),
      active(0),
      selfDestruct(false),
      extended(false),
      d_ptr(new QPaintEnginePrivate)
{
    d_ptr->q_ptr = this;
}